

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

string * __thiscall
zstr::Exception::error_to_message_abi_cxx11_
          (string *__return_storage_ptr__,Exception *this,z_stream *zstrm_p,int ret)

{
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [11];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"zlib: ",(allocator *)local_190);
  if ((int)zstrm_p + 6U < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::ostream::operator<<(local_190,(int)zstrm_p);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_2d0,"[",&local_2f0);
    std::operator+(&local_2b0,&local_2d0,"]: ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  if (*(long *)&this[1].field_0x10 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::to_string(&local_230,*(unsigned_long *)this);
  std::operator+(&local_210," (next_in: ",&local_230);
  std::operator+(&local_1f0,&local_210,", avail_in: ");
  std::__cxx11::to_string(&local_250,(ulong)*(uint *)&this->field_0x8);
  std::operator+(&local_1d0,&local_1f0,&local_250);
  std::operator+(&local_1b0,&local_1d0,", next_out: ");
  std::__cxx11::to_string(&local_270,*(unsigned_long *)&this->field_0x18);
  std::operator+(&local_2f0,&local_1b0,&local_270);
  std::operator+(&local_2d0,&local_2f0,", avail_out: ");
  std::__cxx11::to_string(&local_290,(ulong)*(uint *)(this + 1));
  std::operator+(&local_2b0,&local_2d0,&local_290);
  std::operator+(local_190,&local_2b0,")");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  return __return_storage_ptr__;
}

Assistant:

static std::string error_to_message(z_stream* zstrm_p, int ret) {
    std::string msg = "zlib: ";
    switch (ret) {
      case Z_STREAM_ERROR:
        msg += "Z_STREAM_ERROR: ";
        break;
      case Z_DATA_ERROR:
        msg += "Z_DATA_ERROR: ";
        break;
      case Z_MEM_ERROR:
        msg += "Z_MEM_ERROR: ";
        break;
      case Z_VERSION_ERROR:
        msg += "Z_VERSION_ERROR: ";
        break;
      case Z_BUF_ERROR:
        msg += "Z_BUF_ERROR: ";
        break;
      default:
        std::ostringstream oss;
        oss << ret;
        msg += "[" + oss.str() + "]: ";
        break;
    }
    if (zstrm_p->msg) {
      msg += zstrm_p->msg;
    }
    msg +=
        " ("
        "next_in: " +
        std::to_string(uintptr_t(zstrm_p->next_in)) +
        ", avail_in: " + std::to_string(uintptr_t(zstrm_p->avail_in)) +
        ", next_out: " + std::to_string(uintptr_t(zstrm_p->next_out)) +
        ", avail_out: " + std::to_string(uintptr_t(zstrm_p->avail_out)) + ")";
    return msg;
  }